

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm_sse2.c
# Opt level: O2

void fadst8x16_new_sse2(__m128i *input,__m128i *output,int8_t cos_bit)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  undefined7 in_register_00000011;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  __m128i alVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar20 [16];
  __m128i alVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar37 [16];
  __m128i alVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  __m128i alVar68;
  undefined1 auVar69 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar91 [16];
  __m128i alVar92;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar114 [16];
  __m128i alVar115;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  __m128i alVar123;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  __m128i alVar145;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar169 [16];
  __m128i alVar170;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  __m128i alVar178;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar218 [16];
  __m128i alVar219;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined2 local_b8;
  undefined2 uStack_b6;
  undefined2 uStack_b4;
  undefined2 uStack_b2;
  undefined2 uStack_b0;
  undefined2 uStack_ae;
  undefined2 uStack_ac;
  undefined2 uStack_aa;
  longlong local_a8;
  longlong lStack_a0;
  undefined2 local_98;
  undefined2 uStack_96;
  undefined2 uStack_94;
  undefined2 uStack_92;
  undefined2 uStack_90;
  undefined2 uStack_8e;
  undefined2 uStack_8c;
  undefined2 uStack_8a;
  undefined2 local_88;
  undefined2 uStack_86;
  undefined2 uStack_84;
  undefined2 uStack_82;
  undefined2 uStack_80;
  undefined2 uStack_7e;
  undefined2 uStack_7c;
  undefined2 uStack_7a;
  longlong local_58;
  longlong lStack_50;
  longlong local_48;
  longlong lStack_40;
  longlong local_38;
  longlong lStack_30;
  undefined2 local_28;
  undefined2 uStack_26;
  undefined2 uStack_24;
  undefined2 uStack_22;
  undefined2 uStack_20;
  undefined2 uStack_1e;
  undefined2 uStack_1c;
  undefined2 uStack_1a;
  longlong local_18;
  longlong lStack_10;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar25 [16];
  undefined1 auVar34 [16];
  undefined1 auVar26 [16];
  undefined1 auVar35 [16];
  undefined1 auVar27 [16];
  undefined1 auVar36 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar70 [16];
  undefined1 auVar81 [16];
  undefined1 auVar88 [16];
  undefined1 auVar71 [16];
  undefined1 auVar82 [16];
  undefined1 auVar89 [16];
  undefined1 auVar72 [16];
  undefined1 auVar83 [16];
  undefined1 auVar90 [16];
  undefined1 auVar96 [16];
  undefined1 auVar105 [16];
  undefined1 auVar111 [16];
  undefined1 auVar97 [16];
  undefined1 auVar106 [16];
  undefined1 auVar112 [16];
  undefined1 auVar98 [16];
  undefined1 auVar107 [16];
  undefined1 auVar113 [16];
  undefined1 auVar129 [16];
  undefined1 auVar135 [16];
  undefined1 auVar130 [16];
  undefined1 auVar136 [16];
  undefined1 auVar131 [16];
  undefined1 auVar137 [16];
  undefined1 auVar155 [16];
  undefined1 auVar160 [16];
  undefined1 auVar166 [16];
  undefined1 auVar156 [16];
  undefined1 auVar161 [16];
  undefined1 auVar167 [16];
  undefined1 auVar157 [16];
  undefined1 auVar162 [16];
  undefined1 auVar168 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar196 [16];
  undefined1 auVar202 [16];
  undefined1 auVar210 [16];
  undefined1 auVar215 [16];
  undefined1 auVar197 [16];
  undefined1 auVar203 [16];
  undefined1 auVar211 [16];
  undefined1 auVar216 [16];
  undefined1 auVar198 [16];
  undefined1 auVar204 [16];
  undefined1 auVar212 [16];
  undefined1 auVar217 [16];
  
  uVar5 = (uint)CONCAT71(in_register_00000011,cos_bit);
  auVar93 = ZEXT416(uVar5);
  lVar2 = (long)(int)uVar5 * 0x100;
  iVar3 = 1 << (cos_bit - 1U & 0x1f);
  uVar5 = *(uint *)((long)vert_filter_length_chroma + lVar2 + 0x1e0);
  uVar6 = uVar5 & 0xffff;
  iVar7 = uVar6 * 0x10001;
  auVar51._4_4_ = iVar7;
  auVar51._0_4_ = iVar7;
  auVar51._8_4_ = iVar7;
  auVar51._12_4_ = iVar7;
  iVar7 = uVar6 + uVar5 * -0x10000;
  auVar116._4_4_ = iVar7;
  auVar116._0_4_ = iVar7;
  auVar116._8_4_ = iVar7;
  auVar116._12_4_ = iVar7;
  auVar13 = psubsw((undefined1  [16])0x0,(undefined1  [16])input[0xf]);
  auVar124 = psubsw((undefined1  [16])0x0,(undefined1  [16])input[7]);
  auVar22 = psubsw((undefined1  [16])0x0,(undefined1  [16])input[3]);
  auVar148 = psubsw((undefined1  [16])0x0,(undefined1  [16])input[0xb]);
  alVar12 = input[4];
  auVar171 = psubsw((undefined1  [16])0x0,(undefined1  [16])input[9]);
  alVar21 = input[6];
  auVar39 = psubsw((undefined1  [16])0x0,(undefined1  [16])input[5]);
  auVar72._0_12_ = auVar124._0_12_;
  auVar72._12_2_ = auVar124._6_2_;
  auVar72._14_2_ = *(undefined2 *)((long)input[8] + 6);
  auVar71._12_4_ = auVar72._12_4_;
  auVar71._0_10_ = auVar124._0_10_;
  auVar71._10_2_ = *(undefined2 *)((long)input[8] + 4);
  auVar70._10_6_ = auVar71._10_6_;
  auVar70._0_8_ = auVar124._0_8_;
  auVar70._8_2_ = auVar124._4_2_;
  auVar69._8_8_ = auVar70._8_8_;
  auVar69._6_2_ = *(undefined2 *)((long)input[8] + 2);
  auVar69._4_2_ = auVar124._2_2_;
  auVar69._0_2_ = auVar124._0_2_;
  auVar69._2_2_ = (short)input[8][0];
  auVar125._2_2_ = (short)input[8][1];
  auVar125._0_2_ = auVar124._8_2_;
  auVar125._4_2_ = auVar124._10_2_;
  auVar125._6_2_ = *(undefined2 *)((long)input[8] + 10);
  auVar125._8_2_ = auVar124._12_2_;
  auVar125._10_2_ = *(undefined2 *)((long)input[8] + 0xc);
  auVar125._12_2_ = auVar124._14_2_;
  auVar125._14_2_ = *(undefined2 *)((long)input[8] + 0xe);
  auVar124 = pmaddwd(auVar69,auVar51);
  auVar192 = pmaddwd(auVar125,auVar51);
  auVar73 = pmaddwd(auVar69,auVar116);
  auVar126 = pmaddwd(auVar125,auVar116);
  auVar132._0_4_ = auVar124._0_4_ + iVar3 >> auVar93;
  auVar132._4_4_ = auVar124._4_4_ + iVar3 >> auVar93;
  auVar132._8_4_ = auVar124._8_4_ + iVar3 >> auVar93;
  auVar132._12_4_ = auVar124._12_4_ + iVar3 >> auVar93;
  auVar193._0_4_ = auVar192._0_4_ + iVar3 >> auVar93;
  auVar193._4_4_ = auVar192._4_4_ + iVar3 >> auVar93;
  auVar193._8_4_ = auVar192._8_4_ + iVar3 >> auVar93;
  auVar193._12_4_ = auVar192._12_4_ + iVar3 >> auVar93;
  auVar74._0_4_ = auVar73._0_4_ + iVar3 >> auVar93;
  auVar74._4_4_ = auVar73._4_4_ + iVar3 >> auVar93;
  auVar74._8_4_ = auVar73._8_4_ + iVar3 >> auVar93;
  auVar74._12_4_ = auVar73._12_4_ + iVar3 >> auVar93;
  auVar127._0_4_ = auVar126._0_4_ + iVar3 >> auVar93;
  auVar127._4_4_ = auVar126._4_4_ + iVar3 >> auVar93;
  auVar127._8_4_ = auVar126._8_4_ + iVar3 >> auVar93;
  auVar127._12_4_ = auVar126._12_4_ + iVar3 >> auVar93;
  auVar124 = packssdw(auVar132,auVar193);
  auVar73 = packssdw(auVar74,auVar127);
  auVar131._0_12_ = alVar12._0_12_;
  auVar131._12_2_ = alVar12[0]._6_2_;
  auVar131._14_2_ = auVar148._6_2_;
  auVar130._12_4_ = auVar131._12_4_;
  auVar130._0_10_ = alVar12._0_10_;
  auVar130._10_2_ = auVar148._4_2_;
  auVar129._10_6_ = auVar130._10_6_;
  auVar129._0_8_ = alVar12[0];
  auVar129._8_2_ = alVar12[0]._4_2_;
  auVar128._8_8_ = auVar129._8_8_;
  auVar128._6_2_ = auVar148._2_2_;
  auVar128._4_2_ = alVar12[0]._2_2_;
  auVar128._0_2_ = (undefined2)alVar12[0];
  auVar128._2_2_ = auVar148._0_2_;
  auVar179._2_2_ = auVar148._8_2_;
  auVar179._0_2_ = (short)alVar12[1];
  auVar179._4_2_ = alVar12[1]._2_2_;
  auVar179._6_2_ = auVar148._10_2_;
  auVar179._8_2_ = alVar12[1]._4_2_;
  auVar179._10_2_ = auVar148._12_2_;
  auVar179._12_2_ = alVar12[1]._6_2_;
  auVar179._14_2_ = auVar148._14_2_;
  auVar126 = pmaddwd(auVar128,auVar51);
  auVar192 = pmaddwd(auVar179,auVar51);
  auVar132 = pmaddwd(auVar128,auVar116);
  auVar148 = pmaddwd(auVar179,auVar116);
  auVar149._0_4_ = auVar126._0_4_ + iVar3 >> auVar93;
  auVar149._4_4_ = auVar126._4_4_ + iVar3 >> auVar93;
  auVar149._8_4_ = auVar126._8_4_ + iVar3 >> auVar93;
  auVar149._12_4_ = auVar126._12_4_ + iVar3 >> auVar93;
  auVar194._0_4_ = auVar192._0_4_ + iVar3 >> auVar93;
  auVar194._4_4_ = auVar192._4_4_ + iVar3 >> auVar93;
  auVar194._8_4_ = auVar192._8_4_ + iVar3 >> auVar93;
  auVar194._12_4_ = auVar192._12_4_ + iVar3 >> auVar93;
  auVar150 = packssdw(auVar149,auVar194);
  auVar133._0_4_ = auVar132._0_4_ + iVar3 >> auVar93;
  auVar133._4_4_ = auVar132._4_4_ + iVar3 >> auVar93;
  auVar133._8_4_ = auVar132._8_4_ + iVar3 >> auVar93;
  auVar133._12_4_ = auVar132._12_4_ + iVar3 >> auVar93;
  auVar180._0_4_ = auVar148._0_4_ + iVar3 >> auVar93;
  auVar180._4_4_ = auVar148._4_4_ + iVar3 >> auVar93;
  auVar180._8_4_ = auVar148._8_4_ + iVar3 >> auVar93;
  auVar180._12_4_ = auVar148._12_4_ + iVar3 >> auVar93;
  auVar192 = packssdw(auVar133,auVar180);
  auVar198._0_12_ = alVar21._0_12_;
  auVar198._12_2_ = alVar21[0]._6_2_;
  auVar198._14_2_ = auVar171._6_2_;
  auVar197._12_4_ = auVar198._12_4_;
  auVar197._0_10_ = alVar21._0_10_;
  auVar197._10_2_ = auVar171._4_2_;
  auVar196._10_6_ = auVar197._10_6_;
  auVar196._0_8_ = alVar21[0];
  auVar196._8_2_ = alVar21[0]._4_2_;
  auVar195._8_8_ = auVar196._8_8_;
  auVar195._6_2_ = auVar171._2_2_;
  auVar195._4_2_ = alVar21[0]._2_2_;
  auVar195._0_2_ = (undefined2)alVar21[0];
  auVar195._2_2_ = auVar171._0_2_;
  auVar146._2_2_ = auVar171._8_2_;
  auVar146._0_2_ = (short)alVar21[1];
  auVar146._4_2_ = alVar21[1]._2_2_;
  auVar146._6_2_ = auVar171._10_2_;
  auVar146._8_2_ = alVar21[1]._4_2_;
  auVar146._10_2_ = auVar171._12_2_;
  auVar146._12_2_ = alVar21[1]._6_2_;
  auVar146._14_2_ = auVar171._14_2_;
  auVar132 = pmaddwd(auVar195,auVar51);
  auVar126 = pmaddwd(auVar146,auVar51);
  auVar172._0_4_ = auVar132._0_4_ + iVar3 >> auVar93;
  auVar172._4_4_ = auVar132._4_4_ + iVar3 >> auVar93;
  auVar172._8_4_ = auVar132._8_4_ + iVar3 >> auVar93;
  auVar172._12_4_ = auVar132._12_4_ + iVar3 >> auVar93;
  auVar181._0_4_ = auVar126._0_4_ + iVar3 >> auVar93;
  auVar181._4_4_ = auVar126._4_4_ + iVar3 >> auVar93;
  auVar181._8_4_ = auVar126._8_4_ + iVar3 >> auVar93;
  auVar181._12_4_ = auVar126._12_4_ + iVar3 >> auVar93;
  auVar173 = packssdw(auVar172,auVar181);
  auVar126 = pmaddwd(auVar195,auVar116);
  auVar132 = pmaddwd(auVar146,auVar116);
  auVar199._0_4_ = auVar126._0_4_ + iVar3 >> auVar93;
  auVar199._4_4_ = auVar126._4_4_ + iVar3 >> auVar93;
  auVar199._8_4_ = auVar126._8_4_ + iVar3 >> auVar93;
  auVar199._12_4_ = auVar126._12_4_ + iVar3 >> auVar93;
  auVar147._0_4_ = auVar132._0_4_ + iVar3 >> auVar93;
  auVar147._4_4_ = auVar132._4_4_ + iVar3 >> auVar93;
  auVar147._8_4_ = auVar132._8_4_ + iVar3 >> auVar93;
  auVar147._12_4_ = auVar132._12_4_ + iVar3 >> auVar93;
  auVar200 = packssdw(auVar199,auVar147);
  auVar185._0_12_ = auVar39._0_12_;
  auVar185._12_2_ = auVar39._6_2_;
  auVar185._14_2_ = *(undefined2 *)((long)input[10] + 6);
  auVar184._12_4_ = auVar185._12_4_;
  auVar184._0_10_ = auVar39._0_10_;
  auVar184._10_2_ = *(undefined2 *)((long)input[10] + 4);
  auVar183._10_6_ = auVar184._10_6_;
  auVar183._0_8_ = auVar39._0_8_;
  auVar183._8_2_ = auVar39._4_2_;
  auVar182._8_8_ = auVar183._8_8_;
  auVar182._6_2_ = *(undefined2 *)((long)input[10] + 2);
  auVar182._4_2_ = auVar39._2_2_;
  auVar182._0_2_ = auVar39._0_2_;
  auVar182._2_2_ = (short)input[10][0];
  auVar40._2_2_ = (short)input[10][1];
  auVar40._0_2_ = auVar39._8_2_;
  auVar40._4_2_ = auVar39._10_2_;
  auVar40._6_2_ = *(undefined2 *)((long)input[10] + 10);
  auVar40._8_2_ = auVar39._12_2_;
  auVar40._10_2_ = *(undefined2 *)((long)input[10] + 0xc);
  auVar40._12_2_ = auVar39._14_2_;
  auVar40._14_2_ = *(undefined2 *)((long)input[10] + 0xe);
  auVar148 = pmaddwd(auVar182,auVar51);
  auVar39 = pmaddwd(auVar51,auVar40);
  auVar126 = pmaddwd(auVar182,auVar116);
  auVar132 = pmaddwd(auVar40,auVar116);
  auVar171 = psubsw((undefined1  [16])0x0,(undefined1  [16])input[1]);
  auVar220._0_4_ = auVar148._0_4_ + iVar3 >> auVar93;
  auVar220._4_4_ = auVar148._4_4_ + iVar3 >> auVar93;
  auVar220._8_4_ = auVar148._8_4_ + iVar3 >> auVar93;
  auVar220._12_4_ = auVar148._12_4_ + iVar3 >> auVar93;
  auVar52._0_4_ = auVar39._0_4_ + iVar3 >> auVar93;
  auVar52._4_4_ = auVar39._4_4_ + iVar3 >> auVar93;
  auVar52._8_4_ = auVar39._8_4_ + iVar3 >> auVar93;
  auVar52._12_4_ = auVar39._12_4_ + iVar3 >> auVar93;
  auVar221 = packssdw(auVar220,auVar52);
  auVar186._0_4_ = auVar126._0_4_ + iVar3 >> auVar93;
  auVar186._4_4_ = auVar126._4_4_ + iVar3 >> auVar93;
  auVar186._8_4_ = auVar126._8_4_ + iVar3 >> auVar93;
  auVar186._12_4_ = auVar126._12_4_ + iVar3 >> auVar93;
  auVar41._0_4_ = auVar132._0_4_ + iVar3 >> auVar93;
  auVar41._4_4_ = auVar132._4_4_ + iVar3 >> auVar93;
  auVar41._8_4_ = auVar132._8_4_ + iVar3 >> auVar93;
  auVar41._12_4_ = auVar132._12_4_ + iVar3 >> auVar93;
  auVar187 = packssdw(auVar186,auVar41);
  auVar148 = paddsw((undefined1  [16])*input,auVar124);
  auVar53 = psubsw((undefined1  [16])*input,auVar124);
  auVar124 = paddsw(auVar13,auVar73);
  auVar126 = psubsw(auVar13,auVar73);
  auVar132 = paddsw(auVar22,auVar150);
  auVar150 = psubsw(auVar22,auVar150);
  auVar22 = paddsw((undefined1  [16])input[0xc],auVar192);
  auVar39 = psubsw((undefined1  [16])input[0xc],auVar192);
  auVar13 = psubsw((undefined1  [16])0x0,(undefined1  [16])input[0xd]);
  auVar151 = paddsw(auVar171,auVar173);
  auVar117 = psubsw(auVar171,auVar173);
  auVar75 = paddsw((undefined1  [16])input[0xe],auVar200);
  auVar171 = psubsw((undefined1  [16])input[0xe],auVar200);
  auVar192 = paddsw((undefined1  [16])input[2],auVar221);
  auVar173 = psubsw((undefined1  [16])input[2],auVar221);
  auVar221 = paddsw(auVar13,auVar187);
  auVar73 = psubsw(auVar13,auVar187);
  auVar137._0_12_ = auVar132._0_12_;
  auVar137._12_2_ = auVar132._6_2_;
  auVar137._14_2_ = auVar22._6_2_;
  auVar136._12_4_ = auVar137._12_4_;
  auVar136._0_10_ = auVar132._0_10_;
  auVar136._10_2_ = auVar22._4_2_;
  auVar135._10_6_ = auVar136._10_6_;
  auVar135._0_8_ = auVar132._0_8_;
  auVar135._8_2_ = auVar132._4_2_;
  auVar134._8_8_ = auVar135._8_8_;
  auVar134._6_2_ = auVar22._2_2_;
  auVar134._4_2_ = auVar132._2_2_;
  auVar134._0_2_ = auVar132._0_2_;
  auVar134._2_2_ = auVar22._0_2_;
  auVar13._2_2_ = auVar22._8_2_;
  auVar13._0_2_ = auVar132._8_2_;
  auVar13._4_2_ = auVar132._10_2_;
  auVar13._6_2_ = auVar22._10_2_;
  auVar13._8_2_ = auVar132._12_2_;
  auVar13._10_2_ = auVar22._12_2_;
  auVar13._12_2_ = auVar132._14_2_;
  auVar13._14_2_ = auVar22._14_2_;
  uVar5 = *(uint *)((long)vert_filter_length_chroma + lVar2 + 0x1a0);
  uVar6 = *(uint *)((long)vert_filter_length_chroma + lVar2 + 0x220);
  uVar8 = uVar6 << 0x10 | uVar5 & 0xffff;
  auVar222._4_4_ = uVar8;
  auVar222._0_4_ = uVar8;
  auVar222._8_4_ = uVar8;
  auVar222._12_4_ = uVar8;
  iVar7 = (uVar6 & 0xffff) + uVar5 * -0x10000;
  auVar188._4_4_ = iVar7;
  auVar188._0_4_ = iVar7;
  auVar188._8_4_ = iVar7;
  auVar188._12_4_ = iVar7;
  auVar187 = pmaddwd(auVar134,auVar222);
  auVar22 = pmaddwd(auVar13,auVar222);
  auVar200 = pmaddwd(auVar134,auVar188);
  auVar132 = pmaddwd(auVar13,auVar188);
  auVar118._0_4_ = auVar187._0_4_ + iVar3 >> auVar93;
  auVar118._4_4_ = auVar187._4_4_ + iVar3 >> auVar93;
  auVar118._8_4_ = auVar187._8_4_ + iVar3 >> auVar93;
  auVar118._12_4_ = auVar187._12_4_ + iVar3 >> auVar93;
  auVar164._0_4_ = auVar22._0_4_ + iVar3 >> auVar93;
  auVar164._4_4_ = auVar22._4_4_ + iVar3 >> auVar93;
  auVar164._8_4_ = auVar22._8_4_ + iVar3 >> auVar93;
  auVar164._12_4_ = auVar22._12_4_ + iVar3 >> auVar93;
  auVar138._0_4_ = auVar200._0_4_ + iVar3 >> auVar93;
  auVar138._4_4_ = auVar200._4_4_ + iVar3 >> auVar93;
  auVar138._8_4_ = auVar200._8_4_ + iVar3 >> auVar93;
  auVar138._12_4_ = auVar200._12_4_ + iVar3 >> auVar93;
  auVar22._0_4_ = auVar132._0_4_ + iVar3 >> auVar93;
  auVar22._4_4_ = auVar132._4_4_ + iVar3 >> auVar93;
  auVar22._8_4_ = auVar132._8_4_ + iVar3 >> auVar93;
  auVar22._12_4_ = auVar132._12_4_ + iVar3 >> auVar93;
  auVar187 = packssdw(auVar118,auVar164);
  auVar200 = packssdw(auVar138,auVar22);
  local_b8 = auVar39._0_2_;
  uStack_b6 = auVar39._2_2_;
  uStack_b4 = auVar39._4_2_;
  uStack_b2 = auVar39._6_2_;
  uStack_b0 = auVar39._8_2_;
  uStack_ae = auVar39._10_2_;
  uStack_ac = auVar39._12_2_;
  uStack_aa = auVar39._14_2_;
  auVar204._0_12_ = auVar150._0_12_;
  auVar204._12_2_ = auVar150._6_2_;
  auVar204._14_2_ = uStack_b2;
  auVar203._12_4_ = auVar204._12_4_;
  auVar203._0_10_ = auVar150._0_10_;
  auVar203._10_2_ = uStack_b4;
  auVar202._10_6_ = auVar203._10_6_;
  auVar202._0_8_ = auVar150._0_8_;
  auVar202._8_2_ = auVar150._4_2_;
  auVar201._8_8_ = auVar202._8_8_;
  auVar201._6_2_ = uStack_b6;
  auVar201._4_2_ = auVar150._2_2_;
  auVar201._0_2_ = auVar150._0_2_;
  auVar201._2_2_ = local_b8;
  auVar54._2_2_ = uStack_b0;
  auVar54._0_2_ = auVar150._8_2_;
  auVar54._4_2_ = auVar150._10_2_;
  auVar54._6_2_ = uStack_ae;
  auVar54._8_2_ = auVar150._12_2_;
  auVar54._10_2_ = uStack_ac;
  auVar54._12_2_ = auVar150._14_2_;
  auVar54._14_2_ = uStack_aa;
  uVar5 = -uVar6 & 0xffff | uVar5 * 0x10000;
  auVar39._4_4_ = uVar5;
  auVar39._0_4_ = uVar5;
  auVar39._8_4_ = uVar5;
  auVar39._12_4_ = uVar5;
  auVar132 = pmaddwd(auVar201,auVar39);
  auVar22 = pmaddwd(auVar54,auVar39);
  auVar150 = pmaddwd(auVar201,auVar222);
  auVar13 = pmaddwd(auVar54,auVar222);
  auVar23._0_4_ = auVar132._0_4_ + iVar3 >> auVar93;
  auVar23._4_4_ = auVar132._4_4_ + iVar3 >> auVar93;
  auVar23._8_4_ = auVar132._8_4_ + iVar3 >> auVar93;
  auVar23._12_4_ = auVar132._12_4_ + iVar3 >> auVar93;
  auVar94._0_4_ = auVar22._0_4_ + iVar3 >> auVar93;
  auVar94._4_4_ = auVar22._4_4_ + iVar3 >> auVar93;
  auVar94._8_4_ = auVar22._8_4_ + iVar3 >> auVar93;
  auVar94._12_4_ = auVar22._12_4_ + iVar3 >> auVar93;
  auVar205._0_4_ = auVar150._0_4_ + iVar3 >> auVar93;
  auVar205._4_4_ = auVar150._4_4_ + iVar3 >> auVar93;
  auVar205._8_4_ = auVar150._8_4_ + iVar3 >> auVar93;
  auVar205._12_4_ = auVar150._12_4_ + iVar3 >> auVar93;
  auVar55._0_4_ = auVar13._0_4_ + iVar3 >> auVar93;
  auVar55._4_4_ = auVar13._4_4_ + iVar3 >> auVar93;
  auVar55._8_4_ = auVar13._8_4_ + iVar3 >> auVar93;
  auVar55._12_4_ = auVar13._12_4_ + iVar3 >> auVar93;
  auVar13 = packssdw(auVar23,auVar94);
  auVar206 = packssdw(auVar205,auVar55);
  auVar98._0_12_ = auVar192._0_12_;
  auVar98._12_2_ = auVar192._6_2_;
  auVar98._14_2_ = auVar221._6_2_;
  auVar97._12_4_ = auVar98._12_4_;
  auVar97._0_10_ = auVar192._0_10_;
  auVar97._10_2_ = auVar221._4_2_;
  auVar96._10_6_ = auVar97._10_6_;
  auVar96._0_8_ = auVar192._0_8_;
  auVar96._8_2_ = auVar192._4_2_;
  auVar95._8_8_ = auVar96._8_8_;
  auVar95._6_2_ = auVar221._2_2_;
  auVar95._4_2_ = auVar192._2_2_;
  auVar95._0_2_ = auVar192._0_2_;
  auVar95._2_2_ = auVar221._0_2_;
  auVar42._2_2_ = auVar221._8_2_;
  auVar42._0_2_ = auVar192._8_2_;
  auVar42._4_2_ = auVar192._10_2_;
  auVar42._6_2_ = auVar221._10_2_;
  auVar42._8_2_ = auVar192._12_2_;
  auVar42._10_2_ = auVar221._12_2_;
  auVar42._12_2_ = auVar192._14_2_;
  auVar42._14_2_ = auVar221._14_2_;
  auVar192 = pmaddwd(auVar95,auVar222);
  auVar132 = pmaddwd(auVar42,auVar222);
  auVar22 = pmaddwd(auVar95,auVar188);
  auVar174._0_4_ = auVar192._0_4_ + iVar3 >> auVar93;
  auVar174._4_4_ = auVar192._4_4_ + iVar3 >> auVar93;
  auVar174._8_4_ = auVar192._8_4_ + iVar3 >> auVar93;
  auVar174._12_4_ = auVar192._12_4_ + iVar3 >> auVar93;
  auVar56._0_4_ = auVar132._0_4_ + iVar3 >> auVar93;
  auVar56._4_4_ = auVar132._4_4_ + iVar3 >> auVar93;
  auVar56._8_4_ = auVar132._8_4_ + iVar3 >> auVar93;
  auVar56._12_4_ = auVar132._12_4_ + iVar3 >> auVar93;
  auVar132 = pmaddwd(auVar42,auVar188);
  auVar175 = packssdw(auVar174,auVar56);
  auVar99._0_4_ = auVar22._0_4_ + iVar3 >> auVar93;
  auVar99._4_4_ = auVar22._4_4_ + iVar3 >> auVar93;
  auVar99._8_4_ = auVar22._8_4_ + iVar3 >> auVar93;
  auVar99._12_4_ = auVar22._12_4_ + iVar3 >> auVar93;
  auVar43._0_4_ = auVar132._0_4_ + iVar3 >> auVar93;
  auVar43._4_4_ = auVar132._4_4_ + iVar3 >> auVar93;
  auVar43._8_4_ = auVar132._8_4_ + iVar3 >> auVar93;
  auVar43._12_4_ = auVar132._12_4_ + iVar3 >> auVar93;
  auVar221 = packssdw(auVar99,auVar43);
  auVar60._0_12_ = auVar173._0_12_;
  auVar60._12_2_ = auVar173._6_2_;
  auVar60._14_2_ = auVar73._6_2_;
  auVar59._12_4_ = auVar60._12_4_;
  auVar59._0_10_ = auVar173._0_10_;
  auVar59._10_2_ = auVar73._4_2_;
  auVar58._10_6_ = auVar59._10_6_;
  auVar58._0_8_ = auVar173._0_8_;
  auVar58._8_2_ = auVar173._4_2_;
  auVar57._8_8_ = auVar58._8_8_;
  auVar57._6_2_ = auVar73._2_2_;
  auVar57._4_2_ = auVar173._2_2_;
  auVar57._0_2_ = auVar173._0_2_;
  auVar57._2_2_ = auVar73._0_2_;
  auVar76._2_2_ = auVar73._8_2_;
  auVar76._0_2_ = auVar173._8_2_;
  auVar76._4_2_ = auVar173._10_2_;
  auVar76._6_2_ = auVar73._10_2_;
  auVar76._8_2_ = auVar173._12_2_;
  auVar76._10_2_ = auVar73._12_2_;
  auVar76._12_2_ = auVar173._14_2_;
  auVar76._14_2_ = auVar73._14_2_;
  auVar73 = pmaddwd(auVar57,auVar39);
  auVar132 = pmaddwd(auVar39,auVar76);
  auVar22 = pmaddwd(auVar57,auVar222);
  auVar39 = pmaddwd(auVar76,auVar222);
  auVar189._0_4_ = auVar73._0_4_ + iVar3 >> auVar93;
  auVar189._4_4_ = auVar73._4_4_ + iVar3 >> auVar93;
  auVar189._8_4_ = auVar73._8_4_ + iVar3 >> auVar93;
  auVar189._12_4_ = auVar73._12_4_ + iVar3 >> auVar93;
  auVar73._0_4_ = auVar132._0_4_ + iVar3 >> auVar93;
  auVar73._4_4_ = auVar132._4_4_ + iVar3 >> auVar93;
  auVar73._8_4_ = auVar132._8_4_ + iVar3 >> auVar93;
  auVar73._12_4_ = auVar132._12_4_ + iVar3 >> auVar93;
  auVar73 = packssdw(auVar189,auVar73);
  auVar61._0_4_ = auVar22._0_4_ + iVar3 >> auVar93;
  auVar61._4_4_ = auVar22._4_4_ + iVar3 >> auVar93;
  auVar61._8_4_ = auVar22._8_4_ + iVar3 >> auVar93;
  auVar61._12_4_ = auVar22._12_4_ + iVar3 >> auVar93;
  auVar77._0_4_ = auVar39._0_4_ + iVar3 >> auVar93;
  auVar77._4_4_ = auVar39._4_4_ + iVar3 >> auVar93;
  auVar77._8_4_ = auVar39._8_4_ + iVar3 >> auVar93;
  auVar77._12_4_ = auVar39._12_4_ + iVar3 >> auVar93;
  auVar192 = packssdw(auVar61,auVar77);
  auVar150 = paddsw(auVar148,auVar187);
  auVar132 = psubsw(auVar148,auVar187);
  auVar173 = paddsw(auVar124,auVar200);
  auVar124 = psubsw(auVar124,auVar200);
  auVar119 = paddsw(auVar53,auVar13);
  auVar13 = psubsw(auVar53,auVar13);
  auVar187 = paddsw(auVar126,auVar206);
  auVar22 = psubsw(auVar126,auVar206);
  auVar200 = paddsw(auVar151,auVar175);
  auVar151 = psubsw(auVar151,auVar175);
  auVar148 = paddsw(auVar75,auVar221);
  auVar39 = psubsw(auVar75,auVar221);
  auVar221 = paddsw(auVar117,auVar73);
  auVar73 = psubsw(auVar117,auVar73);
  auVar126 = paddsw(auVar171,auVar192);
  auVar53 = psubsw(auVar171,auVar192);
  auVar27._0_12_ = auVar200._0_12_;
  auVar27._12_2_ = auVar200._6_2_;
  auVar27._14_2_ = auVar148._6_2_;
  auVar26._12_4_ = auVar27._12_4_;
  auVar26._0_10_ = auVar200._0_10_;
  auVar26._10_2_ = auVar148._4_2_;
  auVar25._10_6_ = auVar26._10_6_;
  auVar25._0_8_ = auVar200._0_8_;
  auVar25._8_2_ = auVar200._4_2_;
  auVar24._8_8_ = auVar25._8_8_;
  auVar24._6_2_ = auVar148._2_2_;
  auVar24._4_2_ = auVar200._2_2_;
  auVar24._0_2_ = auVar200._0_2_;
  auVar24._2_2_ = auVar148._0_2_;
  auVar78._2_2_ = auVar148._8_2_;
  auVar78._0_2_ = auVar200._8_2_;
  auVar78._4_2_ = auVar200._10_2_;
  auVar78._6_2_ = auVar148._10_2_;
  auVar78._8_2_ = auVar200._12_2_;
  auVar78._10_2_ = auVar148._12_2_;
  auVar78._12_2_ = auVar200._14_2_;
  auVar78._14_2_ = auVar148._14_2_;
  uVar5 = *(uint *)((long)vert_filter_length_chroma + lVar2 + 0x180);
  uVar6 = *(uint *)((long)vert_filter_length_chroma + lVar2 + 0x240);
  uVar8 = uVar6 << 0x10 | uVar5 & 0xffff;
  auVar223._4_4_ = uVar8;
  auVar223._0_4_ = uVar8;
  auVar223._8_4_ = uVar8;
  auVar223._12_4_ = uVar8;
  iVar7 = (uVar6 & 0xffff) + uVar5 * -0x10000;
  auVar62._4_4_ = iVar7;
  auVar62._0_4_ = iVar7;
  auVar62._8_4_ = iVar7;
  auVar62._12_4_ = iVar7;
  auVar171 = pmaddwd(auVar24,auVar223);
  auVar192 = pmaddwd(auVar78,auVar223);
  auVar148 = pmaddwd(auVar24,auVar62);
  auVar44._0_4_ = auVar171._0_4_ + iVar3 >> auVar93;
  auVar44._4_4_ = auVar171._4_4_ + iVar3 >> auVar93;
  auVar44._8_4_ = auVar171._8_4_ + iVar3 >> auVar93;
  auVar44._12_4_ = auVar171._12_4_ + iVar3 >> auVar93;
  auVar100._0_4_ = auVar192._0_4_ + iVar3 >> auVar93;
  auVar100._4_4_ = auVar192._4_4_ + iVar3 >> auVar93;
  auVar100._8_4_ = auVar192._8_4_ + iVar3 >> auVar93;
  auVar100._12_4_ = auVar192._12_4_ + iVar3 >> auVar93;
  auVar171 = pmaddwd(auVar78,auVar62);
  auVar200 = packssdw(auVar44,auVar100);
  auVar28._0_4_ = auVar148._0_4_ + iVar3 >> auVar93;
  auVar28._4_4_ = auVar148._4_4_ + iVar3 >> auVar93;
  auVar28._8_4_ = auVar148._8_4_ + iVar3 >> auVar93;
  auVar28._12_4_ = auVar148._12_4_ + iVar3 >> auVar93;
  auVar79._0_4_ = auVar171._0_4_ + iVar3 >> auVar93;
  auVar79._4_4_ = auVar171._4_4_ + iVar3 >> auVar93;
  auVar79._8_4_ = auVar171._8_4_ + iVar3 >> auVar93;
  auVar79._12_4_ = auVar171._12_4_ + iVar3 >> auVar93;
  auVar75 = packssdw(auVar28,auVar79);
  auVar83._0_12_ = auVar221._0_12_;
  auVar83._12_2_ = auVar221._6_2_;
  auVar83._14_2_ = auVar126._6_2_;
  auVar82._12_4_ = auVar83._12_4_;
  auVar82._0_10_ = auVar221._0_10_;
  auVar82._10_2_ = auVar126._4_2_;
  auVar81._10_6_ = auVar82._10_6_;
  auVar81._0_8_ = auVar221._0_8_;
  auVar81._8_2_ = auVar221._4_2_;
  auVar80._8_8_ = auVar81._8_8_;
  auVar80._6_2_ = auVar126._2_2_;
  auVar80._4_2_ = auVar221._2_2_;
  auVar80._0_2_ = auVar221._0_2_;
  auVar80._2_2_ = auVar126._0_2_;
  auVar207._2_2_ = auVar126._8_2_;
  auVar207._0_2_ = auVar221._8_2_;
  auVar207._4_2_ = auVar221._10_2_;
  auVar207._6_2_ = auVar126._10_2_;
  auVar207._8_2_ = auVar221._12_2_;
  auVar207._10_2_ = auVar126._12_2_;
  auVar207._12_2_ = auVar221._14_2_;
  auVar207._14_2_ = auVar126._14_2_;
  uVar8 = *(uint *)((long)vert_filter_length_chroma + lVar2 + 0x200);
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar2 + 0x1c0);
  iVar7 = (uVar1 & 0xffff) + uVar8 * -0x10000;
  auVar126._4_4_ = iVar7;
  auVar126._0_4_ = iVar7;
  auVar126._8_4_ = iVar7;
  auVar126._12_4_ = iVar7;
  auVar148 = pmaddwd(auVar80,auVar126);
  auVar192 = pmaddwd(auVar207,auVar126);
  uVar4 = uVar1 << 0x10 | uVar8 & 0xffff;
  auVar101._4_4_ = uVar4;
  auVar101._0_4_ = uVar4;
  auVar101._8_4_ = uVar4;
  auVar101._12_4_ = uVar4;
  auVar126 = pmaddwd(auVar80,auVar101);
  auVar171 = pmaddwd(auVar207,auVar101);
  auVar63._0_4_ = auVar126._0_4_ + iVar3 >> auVar93;
  auVar63._4_4_ = auVar126._4_4_ + iVar3 >> auVar93;
  auVar63._8_4_ = auVar126._8_4_ + iVar3 >> auVar93;
  auVar63._12_4_ = auVar126._12_4_ + iVar3 >> auVar93;
  auVar139._0_4_ = auVar171._0_4_ + iVar3 >> auVar93;
  auVar139._4_4_ = auVar171._4_4_ + iVar3 >> auVar93;
  auVar139._8_4_ = auVar171._8_4_ + iVar3 >> auVar93;
  auVar139._12_4_ = auVar171._12_4_ + iVar3 >> auVar93;
  auVar126 = packssdw(auVar63,auVar139);
  auVar84._0_4_ = auVar148._0_4_ + iVar3 >> auVar93;
  auVar84._4_4_ = auVar148._4_4_ + iVar3 >> auVar93;
  auVar84._8_4_ = auVar148._8_4_ + iVar3 >> auVar93;
  auVar84._12_4_ = auVar148._12_4_ + iVar3 >> auVar93;
  auVar208._0_4_ = auVar192._0_4_ + iVar3 >> auVar93;
  auVar208._4_4_ = auVar192._4_4_ + iVar3 >> auVar93;
  auVar208._8_4_ = auVar192._8_4_ + iVar3 >> auVar93;
  auVar208._12_4_ = auVar192._12_4_ + iVar3 >> auVar93;
  auVar221 = packssdw(auVar84,auVar208);
  auVar212._0_12_ = auVar151._0_12_;
  auVar212._12_2_ = auVar151._6_2_;
  auVar212._14_2_ = auVar39._6_2_;
  auVar211._12_4_ = auVar212._12_4_;
  auVar211._0_10_ = auVar151._0_10_;
  auVar211._10_2_ = auVar39._4_2_;
  auVar210._10_6_ = auVar211._10_6_;
  auVar210._0_8_ = auVar151._0_8_;
  auVar210._8_2_ = auVar151._4_2_;
  auVar209._8_8_ = auVar210._8_8_;
  auVar209._6_2_ = auVar39._2_2_;
  auVar209._4_2_ = auVar151._2_2_;
  auVar209._0_2_ = auVar151._0_2_;
  auVar209._2_2_ = auVar39._0_2_;
  auVar152._2_2_ = auVar39._8_2_;
  auVar152._0_2_ = auVar151._8_2_;
  auVar152._4_2_ = auVar151._10_2_;
  auVar152._6_2_ = auVar39._10_2_;
  auVar152._8_2_ = auVar151._12_2_;
  auVar152._10_2_ = auVar39._12_2_;
  auVar152._12_2_ = auVar151._14_2_;
  auVar152._14_2_ = auVar39._14_2_;
  uVar5 = -uVar6 & 0xffff | uVar5 * 0x10000;
  auVar148._4_4_ = uVar5;
  auVar148._0_4_ = uVar5;
  auVar148._8_4_ = uVar5;
  auVar148._12_4_ = uVar5;
  auVar171 = pmaddwd(auVar209,auVar148);
  auVar39 = pmaddwd(auVar148,auVar152);
  auVar192 = pmaddwd(auVar209,auVar223);
  auVar148 = pmaddwd(auVar152,auVar223);
  auVar176._0_4_ = auVar171._0_4_ + iVar3 >> auVar93;
  auVar176._4_4_ = auVar171._4_4_ + iVar3 >> auVar93;
  auVar176._8_4_ = auVar171._8_4_ + iVar3 >> auVar93;
  auVar176._12_4_ = auVar171._12_4_ + iVar3 >> auVar93;
  auVar171._0_4_ = auVar39._0_4_ + iVar3 >> auVar93;
  auVar171._4_4_ = auVar39._4_4_ + iVar3 >> auVar93;
  auVar171._8_4_ = auVar39._8_4_ + iVar3 >> auVar93;
  auVar171._12_4_ = auVar39._12_4_ + iVar3 >> auVar93;
  auVar213._0_4_ = auVar192._0_4_ + iVar3 >> auVar93;
  auVar213._4_4_ = auVar192._4_4_ + iVar3 >> auVar93;
  auVar213._8_4_ = auVar192._8_4_ + iVar3 >> auVar93;
  auVar213._12_4_ = auVar192._12_4_ + iVar3 >> auVar93;
  auVar153._0_4_ = auVar148._0_4_ + iVar3 >> auVar93;
  auVar153._4_4_ = auVar148._4_4_ + iVar3 >> auVar93;
  auVar153._8_4_ = auVar148._8_4_ + iVar3 >> auVar93;
  auVar153._12_4_ = auVar148._12_4_ + iVar3 >> auVar93;
  auVar117 = packssdw(auVar176,auVar171);
  auVar206 = packssdw(auVar213,auVar153);
  auVar157._0_12_ = auVar73._0_12_;
  auVar157._12_2_ = auVar73._6_2_;
  auVar157._14_2_ = auVar53._6_2_;
  auVar156._12_4_ = auVar157._12_4_;
  auVar156._0_10_ = auVar73._0_10_;
  auVar156._10_2_ = auVar53._4_2_;
  auVar155._10_6_ = auVar156._10_6_;
  auVar155._0_8_ = auVar73._0_8_;
  auVar155._8_2_ = auVar73._4_2_;
  auVar154._8_8_ = auVar155._8_8_;
  auVar154._6_2_ = auVar53._2_2_;
  auVar154._4_2_ = auVar73._2_2_;
  auVar154._0_2_ = auVar73._0_2_;
  auVar154._2_2_ = auVar53._0_2_;
  auVar192._2_2_ = auVar53._8_2_;
  auVar192._0_2_ = auVar73._8_2_;
  auVar192._4_2_ = auVar73._10_2_;
  auVar192._6_2_ = auVar53._10_2_;
  auVar192._8_2_ = auVar73._12_2_;
  auVar192._10_2_ = auVar53._12_2_;
  auVar192._12_2_ = auVar73._14_2_;
  auVar192._14_2_ = auVar53._14_2_;
  uVar5 = -uVar1 & 0xffff | uVar8 * 0x10000;
  auVar140._4_4_ = uVar5;
  auVar140._0_4_ = uVar5;
  auVar140._8_4_ = uVar5;
  auVar140._12_4_ = uVar5;
  auVar39 = pmaddwd(auVar154,auVar140);
  auVar73 = pmaddwd(auVar140,auVar192);
  auVar148 = pmaddwd(auVar154,auVar101);
  auVar53._0_4_ = auVar39._0_4_ + iVar3 >> auVar93;
  auVar53._4_4_ = auVar39._4_4_ + iVar3 >> auVar93;
  auVar53._8_4_ = auVar39._8_4_ + iVar3 >> auVar93;
  auVar53._12_4_ = auVar39._12_4_ + iVar3 >> auVar93;
  auVar141._0_4_ = auVar73._0_4_ + iVar3 >> auVar93;
  auVar141._4_4_ = auVar73._4_4_ + iVar3 >> auVar93;
  auVar141._8_4_ = auVar73._8_4_ + iVar3 >> auVar93;
  auVar141._12_4_ = auVar73._12_4_ + iVar3 >> auVar93;
  auVar73 = pmaddwd(auVar192,auVar101);
  auVar39 = packssdw(auVar53,auVar141);
  auVar158._0_4_ = auVar148._0_4_ + iVar3 >> auVar93;
  auVar158._4_4_ = auVar148._4_4_ + iVar3 >> auVar93;
  auVar158._8_4_ = auVar148._8_4_ + iVar3 >> auVar93;
  auVar158._12_4_ = auVar148._12_4_ + iVar3 >> auVar93;
  auVar190._0_4_ = auVar73._0_4_ + iVar3 >> auVar93;
  auVar190._4_4_ = auVar73._4_4_ + iVar3 >> auVar93;
  auVar190._8_4_ = auVar73._8_4_ + iVar3 >> auVar93;
  auVar190._12_4_ = auVar73._12_4_ + iVar3 >> auVar93;
  auVar175 = packssdw(auVar158,auVar190);
  auVar151 = paddsw(auVar150,auVar200);
  auVar224 = psubsw(auVar150,auVar200);
  auVar150 = paddsw(auVar173,auVar75);
  auVar73 = psubsw(auVar173,auVar75);
  auVar192 = paddsw(auVar119,auVar126);
  auVar120 = psubsw(auVar119,auVar126);
  auVar75 = paddsw(auVar187,auVar221);
  auVar126 = psubsw(auVar187,auVar221);
  auVar171 = paddsw(auVar132,auVar117);
  auVar148 = psubsw(auVar132,auVar117);
  auVar200 = paddsw(auVar124,auVar206);
  auVar53 = psubsw(auVar124,auVar206);
  auVar117 = paddsw(auVar13,auVar39);
  auVar39 = psubsw(auVar13,auVar39);
  auVar119 = paddsw(auVar22,auVar175);
  auVar124 = psubsw(auVar22,auVar175);
  auVar162._0_12_ = auVar151._0_12_;
  auVar162._12_2_ = auVar151._6_2_;
  auVar162._14_2_ = auVar150._6_2_;
  auVar161._12_4_ = auVar162._12_4_;
  auVar161._0_10_ = auVar151._0_10_;
  auVar161._10_2_ = auVar150._4_2_;
  auVar160._10_6_ = auVar161._10_6_;
  auVar160._0_8_ = auVar151._0_8_;
  auVar160._8_2_ = auVar151._4_2_;
  auVar159._8_8_ = auVar160._8_8_;
  auVar159._6_2_ = auVar150._2_2_;
  auVar159._4_2_ = auVar151._2_2_;
  auVar159._0_2_ = auVar151._0_2_;
  auVar159._2_2_ = auVar150._0_2_;
  auVar102._2_2_ = auVar150._8_2_;
  auVar102._0_2_ = auVar151._8_2_;
  auVar102._4_2_ = auVar151._10_2_;
  auVar102._6_2_ = auVar150._10_2_;
  auVar102._8_2_ = auVar151._12_2_;
  auVar102._10_2_ = auVar150._12_2_;
  auVar102._12_2_ = auVar151._14_2_;
  auVar102._14_2_ = auVar150._14_2_;
  uVar5 = *(uint *)((long)vert_filter_length_chroma + lVar2 + 0x168);
  uVar6 = *(uint *)((long)vert_filter_length_chroma + lVar2 + 600);
  uVar8 = uVar6 << 0x10 | uVar5 & 0xffff;
  auVar150._4_4_ = uVar8;
  auVar150._0_4_ = uVar8;
  auVar150._8_4_ = uVar8;
  auVar150._12_4_ = uVar8;
  iVar7 = (uVar6 & 0xffff) + uVar5 * -0x10000;
  auVar64._4_4_ = iVar7;
  auVar64._0_4_ = iVar7;
  auVar64._8_4_ = iVar7;
  auVar64._12_4_ = iVar7;
  auVar13 = pmaddwd(auVar159,auVar150);
  auVar132 = pmaddwd(auVar150,auVar102);
  auVar22 = pmaddwd(auVar159,auVar64);
  auVar142._0_4_ = auVar13._0_4_ + iVar3 >> auVar93;
  auVar142._4_4_ = auVar13._4_4_ + iVar3 >> auVar93;
  auVar142._8_4_ = auVar13._8_4_ + iVar3 >> auVar93;
  auVar142._12_4_ = auVar13._12_4_ + iVar3 >> auVar93;
  auVar173._0_4_ = auVar132._0_4_ + iVar3 >> auVar93;
  auVar173._4_4_ = auVar132._4_4_ + iVar3 >> auVar93;
  auVar173._8_4_ = auVar132._8_4_ + iVar3 >> auVar93;
  auVar173._12_4_ = auVar132._12_4_ + iVar3 >> auVar93;
  auVar132 = pmaddwd(auVar102,auVar64);
  auVar150 = packssdw(auVar142,auVar173);
  auVar163._0_4_ = auVar22._0_4_ + iVar3 >> auVar93;
  auVar163._4_4_ = auVar22._4_4_ + iVar3 >> auVar93;
  auVar163._8_4_ = auVar22._8_4_ + iVar3 >> auVar93;
  auVar163._12_4_ = auVar22._12_4_ + iVar3 >> auVar93;
  auVar103._0_4_ = auVar132._0_4_ + iVar3 >> auVar93;
  auVar103._4_4_ = auVar132._4_4_ + iVar3 >> auVar93;
  auVar103._8_4_ = auVar132._8_4_ + iVar3 >> auVar93;
  auVar103._12_4_ = auVar132._12_4_ + iVar3 >> auVar93;
  auVar164 = packssdw(auVar163,auVar103);
  auVar107._0_12_ = auVar192._0_12_;
  auVar107._12_2_ = auVar192._6_2_;
  auVar107._14_2_ = auVar75._6_2_;
  auVar106._12_4_ = auVar107._12_4_;
  auVar106._0_10_ = auVar192._0_10_;
  auVar106._10_2_ = auVar75._4_2_;
  auVar105._10_6_ = auVar106._10_6_;
  auVar105._0_8_ = auVar192._0_8_;
  auVar105._8_2_ = auVar192._4_2_;
  auVar104._8_8_ = auVar105._8_8_;
  auVar104._6_2_ = auVar75._2_2_;
  auVar104._4_2_ = auVar192._2_2_;
  auVar104._0_2_ = auVar192._0_2_;
  auVar104._2_2_ = auVar75._0_2_;
  auVar45._2_2_ = auVar75._8_2_;
  auVar45._0_2_ = auVar192._8_2_;
  auVar45._4_2_ = auVar192._10_2_;
  auVar45._6_2_ = auVar75._10_2_;
  auVar45._8_2_ = auVar192._12_2_;
  auVar45._10_2_ = auVar75._12_2_;
  auVar45._12_2_ = auVar192._14_2_;
  auVar45._14_2_ = auVar75._14_2_;
  uVar5 = *(uint *)((long)vert_filter_length_chroma + lVar2 + 0x188);
  uVar6 = *(uint *)((long)vert_filter_length_chroma + lVar2 + 0x238);
  uVar8 = uVar6 << 0x10 | uVar5 & 0xffff;
  auVar187._4_4_ = uVar8;
  auVar187._0_4_ = uVar8;
  auVar187._8_4_ = uVar8;
  auVar187._12_4_ = uVar8;
  iVar7 = (uVar6 & 0xffff) + uVar5 * -0x10000;
  auVar65._4_4_ = iVar7;
  auVar65._0_4_ = iVar7;
  auVar65._8_4_ = iVar7;
  auVar65._12_4_ = iVar7;
  auVar22 = pmaddwd(auVar104,auVar187);
  auVar132 = pmaddwd(auVar187,auVar45);
  auVar13 = pmaddwd(auVar104,auVar65);
  auVar143._0_4_ = auVar22._0_4_ + iVar3 >> auVar93;
  auVar143._4_4_ = auVar22._4_4_ + iVar3 >> auVar93;
  auVar143._8_4_ = auVar22._8_4_ + iVar3 >> auVar93;
  auVar143._12_4_ = auVar22._12_4_ + iVar3 >> auVar93;
  auVar75._0_4_ = auVar132._0_4_ + iVar3 >> auVar93;
  auVar75._4_4_ = auVar132._4_4_ + iVar3 >> auVar93;
  auVar75._8_4_ = auVar132._8_4_ + iVar3 >> auVar93;
  auVar75._12_4_ = auVar132._12_4_ + iVar3 >> auVar93;
  auVar132 = pmaddwd(auVar45,auVar65);
  auVar173 = packssdw(auVar143,auVar75);
  auVar108._0_4_ = auVar13._0_4_ + iVar3 >> auVar93;
  auVar108._4_4_ = auVar13._4_4_ + iVar3 >> auVar93;
  auVar108._8_4_ = auVar13._8_4_ + iVar3 >> auVar93;
  auVar108._12_4_ = auVar13._12_4_ + iVar3 >> auVar93;
  auVar46._0_4_ = auVar132._0_4_ + iVar3 >> auVar93;
  auVar46._4_4_ = auVar132._4_4_ + iVar3 >> auVar93;
  auVar46._8_4_ = auVar132._8_4_ + iVar3 >> auVar93;
  auVar46._12_4_ = auVar132._12_4_ + iVar3 >> auVar93;
  auVar192 = packssdw(auVar108,auVar46);
  auVar217._0_12_ = auVar171._0_12_;
  auVar217._12_2_ = auVar171._6_2_;
  auVar217._14_2_ = auVar200._6_2_;
  auVar216._12_4_ = auVar217._12_4_;
  auVar216._0_10_ = auVar171._0_10_;
  auVar216._10_2_ = auVar200._4_2_;
  auVar215._10_6_ = auVar216._10_6_;
  auVar215._0_8_ = auVar171._0_8_;
  auVar215._8_2_ = auVar171._4_2_;
  auVar214._8_8_ = auVar215._8_8_;
  auVar214._6_2_ = auVar200._2_2_;
  auVar214._4_2_ = auVar171._2_2_;
  auVar214._0_2_ = auVar171._0_2_;
  auVar214._2_2_ = auVar200._0_2_;
  auVar29._2_2_ = auVar200._8_2_;
  auVar29._0_2_ = auVar171._8_2_;
  auVar29._4_2_ = auVar171._10_2_;
  auVar29._6_2_ = auVar200._10_2_;
  auVar29._8_2_ = auVar171._12_2_;
  auVar29._10_2_ = auVar200._12_2_;
  auVar29._12_2_ = auVar171._14_2_;
  auVar29._14_2_ = auVar200._14_2_;
  uVar5 = *(uint *)((long)vert_filter_length_chroma + lVar2 + 0x1a8);
  uVar6 = *(uint *)((long)vert_filter_length_chroma + lVar2 + 0x218);
  uVar8 = uVar6 << 0x10 | uVar5 & 0xffff;
  auVar200._4_4_ = uVar8;
  auVar200._0_4_ = uVar8;
  auVar200._8_4_ = uVar8;
  auVar200._12_4_ = uVar8;
  iVar7 = (uVar6 & 0xffff) + uVar5 * -0x10000;
  auVar47._4_4_ = iVar7;
  auVar47._0_4_ = iVar7;
  auVar47._8_4_ = iVar7;
  auVar47._12_4_ = iVar7;
  auVar13 = pmaddwd(auVar214,auVar200);
  auVar132 = pmaddwd(auVar200,auVar29);
  auVar22 = pmaddwd(auVar214,auVar47);
  auVar66._0_4_ = auVar13._0_4_ + iVar3 >> auVar93;
  auVar66._4_4_ = auVar13._4_4_ + iVar3 >> auVar93;
  auVar66._8_4_ = auVar13._8_4_ + iVar3 >> auVar93;
  auVar66._12_4_ = auVar13._12_4_ + iVar3 >> auVar93;
  auVar221._0_4_ = auVar132._0_4_ + iVar3 >> auVar93;
  auVar221._4_4_ = auVar132._4_4_ + iVar3 >> auVar93;
  auVar221._8_4_ = auVar132._8_4_ + iVar3 >> auVar93;
  auVar221._12_4_ = auVar132._12_4_ + iVar3 >> auVar93;
  auVar132 = pmaddwd(auVar29,auVar47);
  auVar171 = packssdw(auVar66,auVar221);
  auVar218._0_4_ = auVar22._0_4_ + iVar3 >> auVar93;
  auVar218._4_4_ = auVar22._4_4_ + iVar3 >> auVar93;
  auVar218._8_4_ = auVar22._8_4_ + iVar3 >> auVar93;
  auVar218._12_4_ = auVar22._12_4_ + iVar3 >> auVar93;
  auVar30._0_4_ = auVar132._0_4_ + iVar3 >> auVar93;
  auVar30._4_4_ = auVar132._4_4_ + iVar3 >> auVar93;
  auVar30._8_4_ = auVar132._8_4_ + iVar3 >> auVar93;
  auVar30._12_4_ = auVar132._12_4_ + iVar3 >> auVar93;
  alVar219 = (__m128i)packssdw(auVar218,auVar30);
  auVar168._0_12_ = auVar117._0_12_;
  auVar168._12_2_ = auVar117._6_2_;
  auVar168._14_2_ = auVar119._6_2_;
  auVar167._12_4_ = auVar168._12_4_;
  auVar167._0_10_ = auVar117._0_10_;
  auVar167._10_2_ = auVar119._4_2_;
  auVar166._10_6_ = auVar167._10_6_;
  auVar166._0_8_ = auVar117._0_8_;
  auVar166._8_2_ = auVar117._4_2_;
  auVar165._8_8_ = auVar166._8_8_;
  auVar165._6_2_ = auVar119._2_2_;
  auVar165._4_2_ = auVar117._2_2_;
  auVar165._0_2_ = auVar117._0_2_;
  auVar165._2_2_ = auVar119._0_2_;
  auVar85._2_2_ = auVar119._8_2_;
  auVar85._0_2_ = auVar117._8_2_;
  auVar85._4_2_ = auVar117._10_2_;
  auVar85._6_2_ = auVar119._10_2_;
  auVar85._8_2_ = auVar117._12_2_;
  auVar85._10_2_ = auVar119._12_2_;
  auVar85._12_2_ = auVar117._14_2_;
  auVar85._14_2_ = auVar119._14_2_;
  uVar5 = *(uint *)((long)vert_filter_length_chroma + lVar2 + 0x1c8);
  uVar6 = *(uint *)((long)vert_filter_length_chroma + lVar2 + 0x1f8);
  uVar8 = uVar6 << 0x10 | uVar5 & 0xffff;
  auVar117._4_4_ = uVar8;
  auVar117._0_4_ = uVar8;
  auVar117._8_4_ = uVar8;
  auVar117._12_4_ = uVar8;
  iVar7 = (uVar6 & 0xffff) + uVar5 * -0x10000;
  auVar31._4_4_ = iVar7;
  auVar31._0_4_ = iVar7;
  auVar31._8_4_ = iVar7;
  auVar31._12_4_ = iVar7;
  auVar22 = pmaddwd(auVar165,auVar117);
  auVar132 = pmaddwd(auVar117,auVar85);
  auVar13 = pmaddwd(auVar165,auVar31);
  auVar177._0_4_ = auVar22._0_4_ + iVar3 >> auVar93;
  auVar177._4_4_ = auVar22._4_4_ + iVar3 >> auVar93;
  auVar177._8_4_ = auVar22._8_4_ + iVar3 >> auVar93;
  auVar177._12_4_ = auVar22._12_4_ + iVar3 >> auVar93;
  auVar151._0_4_ = auVar132._0_4_ + iVar3 >> auVar93;
  auVar151._4_4_ = auVar132._4_4_ + iVar3 >> auVar93;
  auVar151._8_4_ = auVar132._8_4_ + iVar3 >> auVar93;
  auVar151._12_4_ = auVar132._12_4_ + iVar3 >> auVar93;
  auVar132 = pmaddwd(auVar85,auVar31);
  alVar178 = (__m128i)packssdw(auVar177,auVar151);
  auVar169._0_4_ = auVar13._0_4_ + iVar3 >> auVar93;
  auVar169._4_4_ = auVar13._4_4_ + iVar3 >> auVar93;
  auVar169._8_4_ = auVar13._8_4_ + iVar3 >> auVar93;
  auVar169._12_4_ = auVar13._12_4_ + iVar3 >> auVar93;
  auVar86._0_4_ = auVar132._0_4_ + iVar3 >> auVar93;
  auVar86._4_4_ = auVar132._4_4_ + iVar3 >> auVar93;
  auVar86._8_4_ = auVar132._8_4_ + iVar3 >> auVar93;
  auVar86._12_4_ = auVar132._12_4_ + iVar3 >> auVar93;
  alVar170 = (__m128i)packssdw(auVar169,auVar86);
  local_28 = auVar73._0_2_;
  uStack_26 = auVar73._2_2_;
  uStack_24 = auVar73._4_2_;
  uStack_22 = auVar73._6_2_;
  uStack_20 = auVar73._8_2_;
  uStack_1e = auVar73._10_2_;
  uStack_1c = auVar73._12_2_;
  uStack_1a = auVar73._14_2_;
  auVar90._0_12_ = auVar224._0_12_;
  auVar90._12_2_ = auVar224._6_2_;
  auVar90._14_2_ = uStack_22;
  auVar89._12_4_ = auVar90._12_4_;
  auVar89._0_10_ = auVar224._0_10_;
  auVar89._10_2_ = uStack_24;
  auVar88._10_6_ = auVar89._10_6_;
  auVar88._0_8_ = auVar224._0_8_;
  auVar88._8_2_ = auVar224._4_2_;
  auVar87._8_8_ = auVar88._8_8_;
  auVar87._6_2_ = uStack_26;
  auVar87._4_2_ = auVar224._2_2_;
  auVar87._0_2_ = auVar224._0_2_;
  auVar87._2_2_ = local_28;
  auVar225._2_2_ = uStack_20;
  auVar225._0_2_ = auVar224._8_2_;
  auVar225._4_2_ = auVar224._10_2_;
  auVar225._6_2_ = uStack_1e;
  auVar225._8_2_ = auVar224._12_2_;
  auVar225._10_2_ = uStack_1c;
  auVar225._12_2_ = auVar224._14_2_;
  auVar225._14_2_ = uStack_1a;
  uVar5 = *(uint *)((long)vert_filter_length_chroma + lVar2 + 0x1e8);
  uVar6 = *(uint *)((long)vert_filter_length_chroma + lVar2 + 0x1d8);
  uVar8 = uVar6 << 0x10 | uVar5 & 0xffff;
  auVar119._4_4_ = uVar8;
  auVar119._0_4_ = uVar8;
  auVar119._8_4_ = uVar8;
  auVar119._12_4_ = uVar8;
  iVar7 = (uVar6 & 0xffff) + uVar5 * -0x10000;
  auVar32._4_4_ = iVar7;
  auVar32._0_4_ = iVar7;
  auVar32._8_4_ = iVar7;
  auVar32._12_4_ = iVar7;
  auVar22 = pmaddwd(auVar87,auVar119);
  auVar132 = pmaddwd(auVar119,auVar225);
  auVar13 = pmaddwd(auVar87,auVar32);
  auVar144._0_4_ = auVar22._0_4_ + iVar3 >> auVar93;
  auVar144._4_4_ = auVar22._4_4_ + iVar3 >> auVar93;
  auVar144._8_4_ = auVar22._8_4_ + iVar3 >> auVar93;
  auVar144._12_4_ = auVar22._12_4_ + iVar3 >> auVar93;
  auVar175._0_4_ = auVar132._0_4_ + iVar3 >> auVar93;
  auVar175._4_4_ = auVar132._4_4_ + iVar3 >> auVar93;
  auVar175._8_4_ = auVar132._8_4_ + iVar3 >> auVar93;
  auVar175._12_4_ = auVar132._12_4_ + iVar3 >> auVar93;
  auVar132 = pmaddwd(auVar225,auVar32);
  alVar145 = (__m128i)packssdw(auVar144,auVar175);
  auVar91._0_4_ = auVar13._0_4_ + iVar3 >> auVar93;
  auVar91._4_4_ = auVar13._4_4_ + iVar3 >> auVar93;
  auVar91._8_4_ = auVar13._8_4_ + iVar3 >> auVar93;
  auVar91._12_4_ = auVar13._12_4_ + iVar3 >> auVar93;
  auVar226._0_4_ = auVar132._0_4_ + iVar3 >> auVar93;
  auVar226._4_4_ = auVar132._4_4_ + iVar3 >> auVar93;
  auVar226._8_4_ = auVar132._8_4_ + iVar3 >> auVar93;
  auVar226._12_4_ = auVar132._12_4_ + iVar3 >> auVar93;
  alVar92 = (__m128i)packssdw(auVar91,auVar226);
  local_b8 = auVar126._0_2_;
  uStack_b6 = auVar126._2_2_;
  uStack_b4 = auVar126._4_2_;
  uStack_b2 = auVar126._6_2_;
  uStack_b0 = auVar126._8_2_;
  uStack_ae = auVar126._10_2_;
  uStack_ac = auVar126._12_2_;
  uStack_aa = auVar126._14_2_;
  auVar36._0_12_ = auVar120._0_12_;
  auVar36._12_2_ = auVar120._6_2_;
  auVar36._14_2_ = uStack_b2;
  auVar35._12_4_ = auVar36._12_4_;
  auVar35._0_10_ = auVar120._0_10_;
  auVar35._10_2_ = uStack_b4;
  auVar34._10_6_ = auVar35._10_6_;
  auVar34._0_8_ = auVar120._0_8_;
  auVar34._8_2_ = auVar120._4_2_;
  auVar33._8_8_ = auVar34._8_8_;
  auVar33._6_2_ = uStack_b6;
  auVar33._4_2_ = auVar120._2_2_;
  auVar33._0_2_ = auVar120._0_2_;
  auVar33._2_2_ = local_b8;
  auVar206._2_2_ = uStack_b0;
  auVar206._0_2_ = auVar120._8_2_;
  auVar206._4_2_ = auVar120._10_2_;
  auVar206._6_2_ = uStack_ae;
  auVar206._8_2_ = auVar120._12_2_;
  auVar206._10_2_ = uStack_ac;
  auVar206._12_2_ = auVar120._14_2_;
  auVar206._14_2_ = uStack_aa;
  uVar5 = *(uint *)((long)vert_filter_length_chroma + lVar2 + 0x208);
  uVar6 = *(uint *)((long)vert_filter_length_chroma + lVar2 + 0x1b8);
  uVar8 = uVar6 << 0x10 | uVar5 & 0xffff;
  auVar120._4_4_ = uVar8;
  auVar120._0_4_ = uVar8;
  auVar120._8_4_ = uVar8;
  auVar120._12_4_ = uVar8;
  iVar7 = (uVar6 & 0xffff) + uVar5 * -0x10000;
  auVar109._4_4_ = iVar7;
  auVar109._0_4_ = iVar7;
  auVar109._8_4_ = iVar7;
  auVar109._12_4_ = iVar7;
  auVar22 = pmaddwd(auVar33,auVar120);
  auVar132 = pmaddwd(auVar120,auVar206);
  auVar13 = pmaddwd(auVar33,auVar109);
  auVar67._0_4_ = auVar22._0_4_ + iVar3 >> auVar93;
  auVar67._4_4_ = auVar22._4_4_ + iVar3 >> auVar93;
  auVar67._8_4_ = auVar22._8_4_ + iVar3 >> auVar93;
  auVar67._12_4_ = auVar22._12_4_ + iVar3 >> auVar93;
  auVar224._0_4_ = auVar132._0_4_ + iVar3 >> auVar93;
  auVar224._4_4_ = auVar132._4_4_ + iVar3 >> auVar93;
  auVar224._8_4_ = auVar132._8_4_ + iVar3 >> auVar93;
  auVar224._12_4_ = auVar132._12_4_ + iVar3 >> auVar93;
  auVar132 = pmaddwd(auVar206,auVar109);
  alVar68 = (__m128i)packssdw(auVar67,auVar224);
  auVar37._0_4_ = auVar13._0_4_ + iVar3 >> auVar93;
  auVar37._4_4_ = auVar13._4_4_ + iVar3 >> auVar93;
  auVar37._8_4_ = auVar13._8_4_ + iVar3 >> auVar93;
  auVar37._12_4_ = auVar13._12_4_ + iVar3 >> auVar93;
  auVar121._0_4_ = auVar132._0_4_ + iVar3 >> auVar93;
  auVar121._4_4_ = auVar132._4_4_ + iVar3 >> auVar93;
  auVar121._8_4_ = auVar132._8_4_ + iVar3 >> auVar93;
  auVar121._12_4_ = auVar132._12_4_ + iVar3 >> auVar93;
  alVar38 = (__m128i)packssdw(auVar37,auVar121);
  local_98 = auVar53._0_2_;
  uStack_96 = auVar53._2_2_;
  uStack_94 = auVar53._4_2_;
  uStack_92 = auVar53._6_2_;
  uStack_90 = auVar53._8_2_;
  uStack_8e = auVar53._10_2_;
  uStack_8c = auVar53._12_2_;
  uStack_8a = auVar53._14_2_;
  auVar113._0_12_ = auVar148._0_12_;
  auVar113._12_2_ = auVar148._6_2_;
  auVar113._14_2_ = uStack_92;
  auVar112._12_4_ = auVar113._12_4_;
  auVar112._0_10_ = auVar148._0_10_;
  auVar112._10_2_ = uStack_94;
  auVar111._10_6_ = auVar112._10_6_;
  auVar111._0_8_ = auVar148._0_8_;
  auVar111._8_2_ = auVar148._4_2_;
  auVar110._8_8_ = auVar111._8_8_;
  auVar110._6_2_ = uStack_96;
  auVar110._4_2_ = auVar148._2_2_;
  auVar110._0_2_ = auVar148._0_2_;
  auVar110._2_2_ = local_98;
  auVar14._2_2_ = uStack_90;
  auVar14._0_2_ = auVar148._8_2_;
  auVar14._4_2_ = auVar148._10_2_;
  auVar14._6_2_ = uStack_8e;
  auVar14._8_2_ = auVar148._12_2_;
  auVar14._10_2_ = uStack_8c;
  auVar14._12_2_ = auVar148._14_2_;
  auVar14._14_2_ = uStack_8a;
  uVar5 = *(uint *)((long)vert_filter_length_chroma + lVar2 + 0x228);
  uVar6 = *(uint *)((long)vert_filter_length_chroma + lVar2 + 0x198);
  uVar8 = uVar6 << 0x10 | uVar5 & 0xffff;
  auVar9._4_4_ = uVar8;
  auVar9._0_4_ = uVar8;
  auVar9._8_4_ = uVar8;
  auVar9._12_4_ = uVar8;
  iVar7 = (uVar6 & 0xffff) + uVar5 * -0x10000;
  auVar48._4_4_ = iVar7;
  auVar48._0_4_ = iVar7;
  auVar48._8_4_ = iVar7;
  auVar48._12_4_ = iVar7;
  auVar22 = pmaddwd(auVar110,auVar9);
  auVar132 = pmaddwd(auVar9,auVar14);
  auVar13 = pmaddwd(auVar110,auVar48);
  auVar122._0_4_ = auVar22._0_4_ + iVar3 >> auVar93;
  auVar122._4_4_ = auVar22._4_4_ + iVar3 >> auVar93;
  auVar122._8_4_ = auVar22._8_4_ + iVar3 >> auVar93;
  auVar122._12_4_ = auVar22._12_4_ + iVar3 >> auVar93;
  auVar10._0_4_ = auVar132._0_4_ + iVar3 >> auVar93;
  auVar10._4_4_ = auVar132._4_4_ + iVar3 >> auVar93;
  auVar10._8_4_ = auVar132._8_4_ + iVar3 >> auVar93;
  auVar10._12_4_ = auVar132._12_4_ + iVar3 >> auVar93;
  auVar132 = pmaddwd(auVar14,auVar48);
  alVar123 = (__m128i)packssdw(auVar122,auVar10);
  auVar114._0_4_ = auVar13._0_4_ + iVar3 >> auVar93;
  auVar114._4_4_ = auVar13._4_4_ + iVar3 >> auVar93;
  auVar114._8_4_ = auVar13._8_4_ + iVar3 >> auVar93;
  auVar114._12_4_ = auVar13._12_4_ + iVar3 >> auVar93;
  auVar15._0_4_ = auVar132._0_4_ + iVar3 >> auVar93;
  auVar15._4_4_ = auVar132._4_4_ + iVar3 >> auVar93;
  auVar15._8_4_ = auVar132._8_4_ + iVar3 >> auVar93;
  auVar15._12_4_ = auVar132._12_4_ + iVar3 >> auVar93;
  alVar115 = (__m128i)packssdw(auVar114,auVar15);
  local_88 = auVar124._0_2_;
  uStack_86 = auVar124._2_2_;
  uStack_84 = auVar124._4_2_;
  uStack_82 = auVar124._6_2_;
  uStack_80 = auVar124._8_2_;
  uStack_7e = auVar124._10_2_;
  uStack_7c = auVar124._12_2_;
  uStack_7a = auVar124._14_2_;
  auVar19._0_12_ = auVar39._0_12_;
  auVar19._12_2_ = auVar39._6_2_;
  auVar19._14_2_ = uStack_82;
  auVar18._12_4_ = auVar19._12_4_;
  auVar18._0_10_ = auVar39._0_10_;
  auVar18._10_2_ = uStack_84;
  auVar17._10_6_ = auVar18._10_6_;
  auVar17._0_8_ = auVar39._0_8_;
  auVar17._8_2_ = auVar39._4_2_;
  auVar16._8_8_ = auVar17._8_8_;
  auVar16._6_2_ = uStack_86;
  auVar16._4_2_ = auVar39._2_2_;
  auVar16._0_2_ = auVar39._0_2_;
  auVar16._2_2_ = local_88;
  auVar124._2_2_ = uStack_80;
  auVar124._0_2_ = auVar39._8_2_;
  auVar124._4_2_ = auVar39._10_2_;
  auVar124._6_2_ = uStack_7e;
  auVar124._8_2_ = auVar39._12_2_;
  auVar124._10_2_ = uStack_7c;
  auVar124._12_2_ = auVar39._14_2_;
  auVar124._14_2_ = uStack_7a;
  uVar5 = *(uint *)((long)vert_filter_length_chroma + lVar2 + 0x178);
  uVar6 = *(uint *)((long)vert_filter_length_chroma + lVar2 + 0x248);
  uVar8 = uVar5 << 0x10 | uVar6 & 0xffff;
  auVar49._4_4_ = uVar8;
  auVar49._0_4_ = uVar8;
  auVar49._8_4_ = uVar8;
  auVar49._12_4_ = uVar8;
  iVar7 = (uVar5 & 0xffff) + uVar6 * -0x10000;
  auVar191._4_4_ = iVar7;
  auVar191._0_4_ = iVar7;
  auVar191._8_4_ = iVar7;
  auVar191._12_4_ = iVar7;
  auVar132 = pmaddwd(auVar16,auVar49);
  auVar22 = pmaddwd(auVar49,auVar124);
  auVar13 = pmaddwd(auVar16,auVar191);
  auVar124 = pmaddwd(auVar124,auVar191);
  auVar11._0_4_ = auVar132._0_4_ + iVar3 >> auVar93;
  auVar11._4_4_ = auVar132._4_4_ + iVar3 >> auVar93;
  auVar11._8_4_ = auVar132._8_4_ + iVar3 >> auVar93;
  auVar11._12_4_ = auVar132._12_4_ + iVar3 >> auVar93;
  auVar50._0_4_ = auVar22._0_4_ + iVar3 >> auVar93;
  auVar50._4_4_ = auVar22._4_4_ + iVar3 >> auVar93;
  auVar50._8_4_ = auVar22._8_4_ + iVar3 >> auVar93;
  auVar50._12_4_ = auVar22._12_4_ + iVar3 >> auVar93;
  auVar20._0_4_ = auVar13._0_4_ + iVar3 >> auVar93;
  auVar20._4_4_ = auVar13._4_4_ + iVar3 >> auVar93;
  auVar20._8_4_ = auVar13._8_4_ + iVar3 >> auVar93;
  auVar20._12_4_ = auVar13._12_4_ + iVar3 >> auVar93;
  alVar12 = (__m128i)packssdw(auVar11,auVar50);
  auVar227._0_4_ = auVar124._0_4_ + iVar3 >> auVar93;
  auVar227._4_4_ = auVar124._4_4_ + iVar3 >> auVar93;
  auVar227._8_4_ = auVar124._8_4_ + iVar3 >> auVar93;
  auVar227._12_4_ = auVar124._12_4_ + iVar3 >> auVar93;
  alVar21 = (__m128i)packssdw(auVar20,auVar227);
  local_38 = auVar164._0_8_;
  lStack_30 = auVar164._8_8_;
  (*output)[0] = local_38;
  (*output)[1] = lStack_30;
  output[1] = alVar12;
  local_58 = auVar192._0_8_;
  lStack_50 = auVar192._8_8_;
  output[2][0] = local_58;
  output[2][1] = lStack_50;
  output[3] = alVar123;
  output[4] = alVar219;
  output[5] = alVar68;
  output[6] = alVar170;
  output[7] = alVar145;
  output[8] = alVar92;
  output[9] = alVar178;
  output[10] = alVar38;
  local_18 = auVar171._0_8_;
  lStack_10 = auVar171._8_8_;
  output[0xb][0] = local_18;
  output[0xb][1] = lStack_10;
  output[0xc] = alVar115;
  local_48 = auVar173._0_8_;
  lStack_40 = auVar173._8_8_;
  output[0xd][0] = local_48;
  output[0xd][1] = lStack_40;
  output[0xe] = alVar21;
  local_a8 = auVar150._0_8_;
  lStack_a0 = auVar150._8_8_;
  output[0xf][0] = local_a8;
  output[0xf][1] = lStack_a0;
  return;
}

Assistant:

static void fadst8x16_new_sse2(const __m128i *input, __m128i *output,
                               int8_t cos_bit) {
  const int32_t *cospi = cospi_arr(cos_bit);
  const __m128i __zero = _mm_setzero_si128();
  const __m128i __rounding = _mm_set1_epi32(1 << (cos_bit - 1));

  __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  __m128i cospi_p32_m32 = pair_set_epi16(cospi[32], -cospi[32]);
  __m128i cospi_p16_p48 = pair_set_epi16(cospi[16], cospi[48]);
  __m128i cospi_p48_m16 = pair_set_epi16(cospi[48], -cospi[16]);
  __m128i cospi_m48_p16 = pair_set_epi16(-cospi[48], cospi[16]);
  __m128i cospi_p08_p56 = pair_set_epi16(cospi[8], cospi[56]);
  __m128i cospi_p56_m08 = pair_set_epi16(cospi[56], -cospi[8]);
  __m128i cospi_p40_p24 = pair_set_epi16(cospi[40], cospi[24]);
  __m128i cospi_p24_m40 = pair_set_epi16(cospi[24], -cospi[40]);
  __m128i cospi_m56_p08 = pair_set_epi16(-cospi[56], cospi[8]);
  __m128i cospi_m24_p40 = pair_set_epi16(-cospi[24], cospi[40]);
  __m128i cospi_p02_p62 = pair_set_epi16(cospi[2], cospi[62]);
  __m128i cospi_p62_m02 = pair_set_epi16(cospi[62], -cospi[2]);
  __m128i cospi_p10_p54 = pair_set_epi16(cospi[10], cospi[54]);
  __m128i cospi_p54_m10 = pair_set_epi16(cospi[54], -cospi[10]);
  __m128i cospi_p18_p46 = pair_set_epi16(cospi[18], cospi[46]);
  __m128i cospi_p46_m18 = pair_set_epi16(cospi[46], -cospi[18]);
  __m128i cospi_p26_p38 = pair_set_epi16(cospi[26], cospi[38]);
  __m128i cospi_p38_m26 = pair_set_epi16(cospi[38], -cospi[26]);
  __m128i cospi_p34_p30 = pair_set_epi16(cospi[34], cospi[30]);
  __m128i cospi_p30_m34 = pair_set_epi16(cospi[30], -cospi[34]);
  __m128i cospi_p42_p22 = pair_set_epi16(cospi[42], cospi[22]);
  __m128i cospi_p22_m42 = pair_set_epi16(cospi[22], -cospi[42]);
  __m128i cospi_p50_p14 = pair_set_epi16(cospi[50], cospi[14]);
  __m128i cospi_p14_m50 = pair_set_epi16(cospi[14], -cospi[50]);
  __m128i cospi_p58_p06 = pair_set_epi16(cospi[58], cospi[6]);
  __m128i cospi_p06_m58 = pair_set_epi16(cospi[6], -cospi[58]);

  // stage 1
  __m128i x1[16];
  x1[0] = input[0];
  x1[1] = _mm_subs_epi16(__zero, input[15]);
  x1[2] = _mm_subs_epi16(__zero, input[7]);
  x1[3] = input[8];
  x1[4] = _mm_subs_epi16(__zero, input[3]);
  x1[5] = input[12];
  x1[6] = input[4];
  x1[7] = _mm_subs_epi16(__zero, input[11]);
  x1[8] = _mm_subs_epi16(__zero, input[1]);
  x1[9] = input[14];
  x1[10] = input[6];
  x1[11] = _mm_subs_epi16(__zero, input[9]);
  x1[12] = input[2];
  x1[13] = _mm_subs_epi16(__zero, input[13]);
  x1[14] = _mm_subs_epi16(__zero, input[5]);
  x1[15] = input[10];

  // stage 2
  __m128i x2[16];
  x2[0] = x1[0];
  x2[1] = x1[1];
  btf_16_sse2(cospi_p32_p32, cospi_p32_m32, x1[2], x1[3], x2[2], x2[3]);
  x2[4] = x1[4];
  x2[5] = x1[5];
  btf_16_sse2(cospi_p32_p32, cospi_p32_m32, x1[6], x1[7], x2[6], x2[7]);
  x2[8] = x1[8];
  x2[9] = x1[9];
  btf_16_sse2(cospi_p32_p32, cospi_p32_m32, x1[10], x1[11], x2[10], x2[11]);
  x2[12] = x1[12];
  x2[13] = x1[13];
  btf_16_sse2(cospi_p32_p32, cospi_p32_m32, x1[14], x1[15], x2[14], x2[15]);

  // stage 3
  __m128i x3[16];
  x3[0] = _mm_adds_epi16(x2[0], x2[2]);
  x3[2] = _mm_subs_epi16(x2[0], x2[2]);
  x3[1] = _mm_adds_epi16(x2[1], x2[3]);
  x3[3] = _mm_subs_epi16(x2[1], x2[3]);
  x3[4] = _mm_adds_epi16(x2[4], x2[6]);
  x3[6] = _mm_subs_epi16(x2[4], x2[6]);
  x3[5] = _mm_adds_epi16(x2[5], x2[7]);
  x3[7] = _mm_subs_epi16(x2[5], x2[7]);
  x3[8] = _mm_adds_epi16(x2[8], x2[10]);
  x3[10] = _mm_subs_epi16(x2[8], x2[10]);
  x3[9] = _mm_adds_epi16(x2[9], x2[11]);
  x3[11] = _mm_subs_epi16(x2[9], x2[11]);
  x3[12] = _mm_adds_epi16(x2[12], x2[14]);
  x3[14] = _mm_subs_epi16(x2[12], x2[14]);
  x3[13] = _mm_adds_epi16(x2[13], x2[15]);
  x3[15] = _mm_subs_epi16(x2[13], x2[15]);

  // stage 4
  __m128i x4[16];
  x4[0] = x3[0];
  x4[1] = x3[1];
  x4[2] = x3[2];
  x4[3] = x3[3];
  btf_16_sse2(cospi_p16_p48, cospi_p48_m16, x3[4], x3[5], x4[4], x4[5]);
  btf_16_sse2(cospi_m48_p16, cospi_p16_p48, x3[6], x3[7], x4[6], x4[7]);
  x4[8] = x3[8];
  x4[9] = x3[9];
  x4[10] = x3[10];
  x4[11] = x3[11];
  btf_16_sse2(cospi_p16_p48, cospi_p48_m16, x3[12], x3[13], x4[12], x4[13]);
  btf_16_sse2(cospi_m48_p16, cospi_p16_p48, x3[14], x3[15], x4[14], x4[15]);

  // stage 5
  __m128i x5[16];
  x5[0] = _mm_adds_epi16(x4[0], x4[4]);
  x5[4] = _mm_subs_epi16(x4[0], x4[4]);
  x5[1] = _mm_adds_epi16(x4[1], x4[5]);
  x5[5] = _mm_subs_epi16(x4[1], x4[5]);
  x5[2] = _mm_adds_epi16(x4[2], x4[6]);
  x5[6] = _mm_subs_epi16(x4[2], x4[6]);
  x5[3] = _mm_adds_epi16(x4[3], x4[7]);
  x5[7] = _mm_subs_epi16(x4[3], x4[7]);
  x5[8] = _mm_adds_epi16(x4[8], x4[12]);
  x5[12] = _mm_subs_epi16(x4[8], x4[12]);
  x5[9] = _mm_adds_epi16(x4[9], x4[13]);
  x5[13] = _mm_subs_epi16(x4[9], x4[13]);
  x5[10] = _mm_adds_epi16(x4[10], x4[14]);
  x5[14] = _mm_subs_epi16(x4[10], x4[14]);
  x5[11] = _mm_adds_epi16(x4[11], x4[15]);
  x5[15] = _mm_subs_epi16(x4[11], x4[15]);

  // stage 6
  __m128i x6[16];
  x6[0] = x5[0];
  x6[1] = x5[1];
  x6[2] = x5[2];
  x6[3] = x5[3];
  x6[4] = x5[4];
  x6[5] = x5[5];
  x6[6] = x5[6];
  x6[7] = x5[7];
  btf_16_sse2(cospi_p08_p56, cospi_p56_m08, x5[8], x5[9], x6[8], x6[9]);
  btf_16_sse2(cospi_p40_p24, cospi_p24_m40, x5[10], x5[11], x6[10], x6[11]);
  btf_16_sse2(cospi_m56_p08, cospi_p08_p56, x5[12], x5[13], x6[12], x6[13]);
  btf_16_sse2(cospi_m24_p40, cospi_p40_p24, x5[14], x5[15], x6[14], x6[15]);

  // stage 7
  __m128i x7[16];
  x7[0] = _mm_adds_epi16(x6[0], x6[8]);
  x7[8] = _mm_subs_epi16(x6[0], x6[8]);
  x7[1] = _mm_adds_epi16(x6[1], x6[9]);
  x7[9] = _mm_subs_epi16(x6[1], x6[9]);
  x7[2] = _mm_adds_epi16(x6[2], x6[10]);
  x7[10] = _mm_subs_epi16(x6[2], x6[10]);
  x7[3] = _mm_adds_epi16(x6[3], x6[11]);
  x7[11] = _mm_subs_epi16(x6[3], x6[11]);
  x7[4] = _mm_adds_epi16(x6[4], x6[12]);
  x7[12] = _mm_subs_epi16(x6[4], x6[12]);
  x7[5] = _mm_adds_epi16(x6[5], x6[13]);
  x7[13] = _mm_subs_epi16(x6[5], x6[13]);
  x7[6] = _mm_adds_epi16(x6[6], x6[14]);
  x7[14] = _mm_subs_epi16(x6[6], x6[14]);
  x7[7] = _mm_adds_epi16(x6[7], x6[15]);
  x7[15] = _mm_subs_epi16(x6[7], x6[15]);

  // stage 8
  __m128i x8[16];
  btf_16_sse2(cospi_p02_p62, cospi_p62_m02, x7[0], x7[1], x8[0], x8[1]);
  btf_16_sse2(cospi_p10_p54, cospi_p54_m10, x7[2], x7[3], x8[2], x8[3]);
  btf_16_sse2(cospi_p18_p46, cospi_p46_m18, x7[4], x7[5], x8[4], x8[5]);
  btf_16_sse2(cospi_p26_p38, cospi_p38_m26, x7[6], x7[7], x8[6], x8[7]);
  btf_16_sse2(cospi_p34_p30, cospi_p30_m34, x7[8], x7[9], x8[8], x8[9]);
  btf_16_sse2(cospi_p42_p22, cospi_p22_m42, x7[10], x7[11], x8[10], x8[11]);
  btf_16_sse2(cospi_p50_p14, cospi_p14_m50, x7[12], x7[13], x8[12], x8[13]);
  btf_16_sse2(cospi_p58_p06, cospi_p06_m58, x7[14], x7[15], x8[14], x8[15]);

  // stage 9
  output[0] = x8[1];
  output[1] = x8[14];
  output[2] = x8[3];
  output[3] = x8[12];
  output[4] = x8[5];
  output[5] = x8[10];
  output[6] = x8[7];
  output[7] = x8[8];
  output[8] = x8[9];
  output[9] = x8[6];
  output[10] = x8[11];
  output[11] = x8[4];
  output[12] = x8[13];
  output[13] = x8[2];
  output[14] = x8[15];
  output[15] = x8[0];
}